

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O1

void __thiscall setup::windows_version::load(windows_version *this,istream *is,version *version)

{
  char buffer [1];
  char buffer_1 [1];
  byte local_1a;
  byte local_19;
  
  data::load(&this->win_version,is,version);
  data::load(&this->nt_version,is,version);
  if (version->value < 0x1031300) {
    (this->nt_service_pack).major = 0;
    (this->nt_service_pack).minor = 0;
  }
  else {
    std::istream::read((char *)is,(long)&local_1a);
    (this->nt_service_pack).minor = (uint)local_1a;
    std::istream::read((char *)is,(long)&local_19);
    (this->nt_service_pack).major = (uint)local_19;
  }
  return;
}

Assistant:

void windows_version::load(std::istream & is, const version & version) {
	
	win_version.load(is, version);
	nt_version.load(is, version);
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		nt_service_pack.minor = util::load<boost::uint8_t>(is);
		nt_service_pack.major = util::load<boost::uint8_t>(is);
	} else {
		nt_service_pack.major = 0, nt_service_pack.minor = 0;
	}
	
}